

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  int iVar1;
  IdxT IVar2;
  uint local_24;
  uint local_20;
  IdxT n;
  IdxT p;
  uint rnd_local;
  IdxT up_local;
  IdxT lo_local;
  lua_State *L_local;
  
  n = rnd;
  p = up;
  rnd_local = lo;
  while( true ) {
    if (p <= rnd_local) {
      return;
    }
    lua_geti(L,1,(ulong)rnd_local);
    lua_geti(L,1,(ulong)p);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      set2(L,rnd_local,p);
    }
    if (p - rnd_local == 1) break;
    if ((p - rnd_local < 100) || (n == 0)) {
      local_20 = rnd_local + p >> 1;
    }
    else {
      local_20 = choosePivot(rnd_local,p,n);
    }
    lua_geti(L,1,(ulong)local_20);
    lua_geti(L,1,(ulong)rnd_local);
    iVar1 = sort_comp(L,-2,-1);
    if (iVar1 == 0) {
      lua_settop(L,-2);
      lua_geti(L,1,(ulong)p);
      iVar1 = sort_comp(L,-1,-2);
      if (iVar1 == 0) {
        lua_settop(L,-3);
      }
      else {
        set2(L,local_20,p);
      }
    }
    else {
      set2(L,local_20,rnd_local);
    }
    if (p - rnd_local == 2) {
      return;
    }
    lua_geti(L,1,(ulong)local_20);
    lua_pushvalue(L,-1);
    lua_geti(L,1,(ulong)(p - 1));
    set2(L,local_20,p - 1);
    IVar2 = partition(L,rnd_local,p);
    if (IVar2 - rnd_local < p - IVar2) {
      auxsort(L,rnd_local,IVar2 - 1,n);
      local_24 = IVar2 - rnd_local;
      rnd_local = IVar2 + 1;
    }
    else {
      auxsort(L,IVar2 + 1,p,n);
      local_24 = p - IVar2;
      p = IVar2 - 1;
    }
    if (local_24 < p - rnd_local >> 7) {
      n = l_randomizePivot();
    }
  }
  return;
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up,
                                   unsigned int rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    lua_geti(L, 1, lo);
    lua_geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    lua_geti(L, 1, p);
    lua_geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      lua_geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    lua_geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    lua_geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot();  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}